

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutablePrimitiveOneofFieldGenerator::GenerateSerializationCode
          (ImmutablePrimitiveOneofFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  char *pcVar1;
  JavaType JVar2;
  
  variables = &(this->super_ImmutablePrimitiveFieldGenerator).variables_;
  io::Printer::Print(printer,variables,
                     "if ($has_oneof_case_message$) {\n  output.write$capitalized_type$(\n");
  JVar2 = GetJavaType((this->super_ImmutablePrimitiveFieldGenerator).descriptor_);
  pcVar1 = "        $number$, ($type$)(($boxed_type$) $oneof_name$_));\n";
  if (JVar2 == JAVATYPE_BYTES) {
    pcVar1 = "        $number$, ($type$) $oneof_name$_);\n";
  }
  io::Printer::Print(printer,variables,pcVar1 + 2);
  io::Printer::Print<>(printer,"}\n");
  return;
}

Assistant:

void ImmutablePrimitiveOneofFieldGenerator::GenerateSerializationCode(
    io::Printer* printer) const {
  printer->Print(variables_,
                 "if ($has_oneof_case_message$) {\n"
                 "  output.write$capitalized_type$(\n");
  // $type$ and $boxed_type$ is the same for bytes fields so we don't need to
  // do redundant casts.
  if (GetJavaType(descriptor_) == JAVATYPE_BYTES) {
    printer->Print(variables_, "      $number$, ($type$) $oneof_name$_);\n");
  } else {
    printer->Print(
        variables_,
        "      $number$, ($type$)(($boxed_type$) $oneof_name$_));\n");
  }
  printer->Print("}\n");
}